

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O0

void sortAndUnique(word **a,Abc_TtStore_t *p)

{
  int iVar1;
  int iVar2;
  word *local_30;
  word *tempWordPtr;
  int local_20;
  int WordsPtrN;
  int count;
  int i;
  Abc_TtStore_t *p_local;
  word **a_local;
  
  local_20 = 1;
  iVar1 = p->nFuncs;
  qsort(a,(long)iVar1,8,compareWords3);
  local_30 = *a;
  for (WordsPtrN = 1; WordsPtrN < iVar1; WordsPtrN = WordsPtrN + 1) {
    iVar2 = memcmp(a[WordsPtrN],local_30,(long)p->nWords << 3);
    if (iVar2 != 0) {
      a[local_20] = a[WordsPtrN];
      local_30 = a[WordsPtrN];
      local_20 = local_20 + 1;
    }
  }
  p->nFuncs = local_20;
  return;
}

Assistant:

void sortAndUnique(word** a, Abc_TtStore_t* p)
{
     int i, count=1, WordsPtrN = p->nFuncs;
     word* tempWordPtr;
     qsort(a,WordsPtrN,sizeof(word*),(int(*)(const void *,const void *))compareWords3);
     tempWordPtr = a[0];
     for(i=1;i<WordsPtrN;i++)   
         if(memcmp(a[i],tempWordPtr,sizeof(word)*(p->nWords)) != 0)
         {
             a[count] = a[i];
             tempWordPtr = a[i];
             count++;
         }
     p->nFuncs = count;
}